

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel_oaa.cc
# Opt level: O2

void predict_or_learn<false>(multi_oaa *o,single_learner *base,example *ec)

{
  labels multilabels;
  labels preds;
  uint local_84;
  label_t *local_80;
  label_t local_78;
  label_t lStack_70;
  label_t local_68;
  label_t lStack_60;
  v_array<unsigned_int> local_58;
  
  local_80 = (label_t *)&ec->l;
  local_78 = (ec->l).multi;
  lStack_70 = (label_t)(ec->l).cs.costs._end;
  local_68 = (label_t)(ec->l).cs.costs.end_array;
  lStack_60 = (label_t)(ec->l).cs.costs.erase_count;
  local_58._begin = (uint *)(ec->pred).scalars._begin;
  local_58._end = (uint *)(ec->pred).scalars._end;
  local_58.end_array = (uint *)(ec->pred).scalars.end_array;
  local_58.erase_count = (ec->pred).scalars.erase_count;
  v_array<unsigned_int>::clear(&local_58);
  (ec->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
  (ec->l).simple.initial = 0.0;
  local_84 = 0;
  while( true ) {
    if (o->k <= (ulong)local_84) break;
    LEARNER::learner<char,_example>::predict(base,ec,(ulong)local_84);
    if (0.0 < (ec->pred).scalar) {
      v_array<unsigned_int>::push_back(&local_58,&local_84);
    }
    local_84 = local_84 + 1;
  }
  (ec->pred).scalars.end_array = (float *)local_58.end_array;
  (ec->pred).scalars.erase_count = local_58.erase_count;
  (ec->pred).scalars._begin = (float *)local_58._begin;
  (ec->pred).scalars._end = (float *)local_58._end;
  local_80[2] = local_68;
  local_80[3] = lStack_60;
  *local_80 = local_78;
  local_80[1] = lStack_70;
  return;
}

Assistant:

void predict_or_learn(multi_oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTILABEL::labels multilabels = ec.l.multilabels;
  MULTILABEL::labels preds = ec.pred.multilabels;
  preds.label_v.clear();

  ec.l.simple = {FLT_MAX, 1.f, 0.f};
  uint32_t multilabel_index = 0;
  for (uint32_t i = 0; i < o.k; i++)
  {
    if (is_learn)
    {
      ec.l.simple.label = -1.f;
      if (multilabels.label_v.size() > multilabel_index && multilabels.label_v[multilabel_index] == i)
      {
        ec.l.simple.label = 1.f;
        multilabel_index++;
      }
      base.learn(ec, i);
    }
    else
      base.predict(ec, i);
    if (ec.pred.scalar > 0.)
      preds.label_v.push_back(i);
  }
  if (is_learn && multilabel_index < multilabels.label_v.size())
    cout << "label " << multilabels.label_v[multilabel_index] << " is not in {0," << o.k - 1
         << "} This won't work right." << endl;

  ec.pred.multilabels = preds;
  ec.l.multilabels = multilabels;
}